

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall ON_BezierCurve::IsValid(ON_BezierCurve *this)

{
  if ((((0 < this->m_dim) && ((uint)this->m_is_rat < 2)) && (1 < this->m_order)) &&
     ((this->m_is_rat + this->m_dim <= this->m_cv_stride &&
      ((this->m_cv_capacity < 1 || (this->m_cv_stride * this->m_order <= this->m_cv_capacity)))))) {
    return this->m_cv != (double *)0x0;
  }
  return false;
}

Assistant:

bool ON_BezierCurve::IsValid() const
{
  if ( m_dim <= 0 )
    return false;
  if ( m_is_rat != 0 && m_is_rat != 1 )
    return false;
  if ( m_order < 2 )
    return false;
  if ( m_cv_stride < m_dim+m_is_rat )
    return false;
  if ( m_cv_capacity > 0 && m_cv_capacity < m_cv_stride*m_order )
    return false;
  if ( m_cv == nullptr )
    return false;
  return true;
}